

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

void lua_pushnil(lua_State *L)

{
  int iVar1;
  int *piVar2;
  StkId pTVar3;
  
  piVar2 = *(int **)&L[-1].hookmask;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  if (iVar1 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x1ec,"void lua_pushnil(lua_State *)");
  }
  pTVar3 = L->top;
  pTVar3->tt_ = 0;
  pTVar3 = pTVar3 + 1;
  L->top = pTVar3;
  if (pTVar3 <= L->ci->top) {
    *piVar2 = 0;
    return;
  }
  __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x1ee,"void lua_pushnil(lua_State *)");
}

Assistant:

LUA_API void lua_pushnil (lua_State *L) {
  lua_lock(L);
  setnilvalue(L->top);
  api_incr_top(L);
  lua_unlock(L);
}